

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O2

string * ws::wx_decode_base64(string *__return_storage_ptr__,string *str_encrypt)

{
  uchar *f;
  int iVar1;
  uchar *puVar2;
  MsgCryptoError *pMVar3;
  long lVar4;
  int n;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  f = (uchar *)(str_encrypt->_M_dataplus)._M_p;
  lVar4 = 0;
  for (puVar2 = f + str_encrypt->_M_string_length; (f < puVar2 && (puVar2[-1] == '='));
      puVar2 = puVar2 + -1) {
    lVar4 = lVar4 + 1;
  }
  n = (int)str_encrypt->_M_string_length;
  puVar2 = (uchar *)malloc((long)n);
  if (puVar2 != (uchar *)0x0) {
    iVar1 = EVP_DecodeBlock(puVar2,f,n);
    if (((int)lVar4 < iVar1) && (iVar1 < n)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__return_storage_ptr__,(char *)puVar2,iVar1 - lVar4);
      free(puVar2);
      return __return_storage_ptr__;
    }
    pMVar3 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"EVP_DecodeBlock() error",&local_71);
    MsgCryptoError::MsgCryptoError(pMVar3,&local_70,(source_location)0x195118);
    __cxa_throw(pMVar3,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
  }
  pMVar3 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"malloc error",&local_71);
  MsgCryptoError::MsgCryptoError(pMVar3,&local_50,(source_location)0x195100);
  __cxa_throw(pMVar3,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string wx_decode_base64(const std::string &str_encrypt)
  {
    std::string ret;
    int eq = 0;
    for (auto r = str_encrypt.crbegin(); r < str_encrypt.crend(); r++)
    {
      if (*r == '=')
      {
        eq++;
      }
      else
      {
        break;
      }
    }
    
    int osize = int(str_encrypt.size());
    char *out = (char *) malloc(osize);
    if (out == nullptr)
    {
      throw MsgCryptoError("malloc error");
    }
    
    int rsize = 0;
    rsize = EVP_DecodeBlock((unsigned char *) out, (const unsigned char *) str_encrypt.c_str(),
                            int(str_encrypt.size()));
    if (rsize > eq && rsize < osize)
    {
      ret.assign(out, rsize - eq);
    }
    else
    {
      throw MsgCryptoError("EVP_DecodeBlock() error");
    }
    
    free(out);
    out = nullptr;
    return ret;
  }